

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_tuple_primitive_firstInstanceWithType
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  do {
    context = (sysbvm_context_t *)(context->heap).firstMallocObject;
    if (context == (sysbvm_context_t *)0x0) {
      return 0;
    }
  } while (*(sysbvm_tuple_t *)
            (((anon_union_16_2_66708f41_for_sysbvm_heap_mallocObjectHeader_s_0 *)&context->heap)->
             words + 4) != *arguments);
  return (sysbvm_tuple_t)
         (((anon_union_16_2_66708f41_for_sysbvm_heap_mallocObjectHeader_s_0 *)&context->heap)->words
         + 4);
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_firstInstanceWithType(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t expectedType = arguments[0];

    sysbvm_heap_mallocObjectHeader_t *nextObject = context->heap.firstMallocObject;
    while(nextObject && ((sysbvm_tuple_header_t *)(nextObject + 1))->typePointer != expectedType)
        nextObject = nextObject->next;
    
    if(!nextObject)
        return SYSBVM_NULL_TUPLE;

    return (sysbvm_tuple_t)(nextObject + 1);
}